

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,supermap::KeyValue<char,unsigned_int>,supermap::KeyValue<char,unsigned_int>>
          (ResultBuilder *this,KeyValue<char,_unsigned_int> *lhs,KeyValue<char,_unsigned_int> *rhs)

{
  ContextOptions *pCVar1;
  KeyValue<char,_unsigned_int> *in_R8;
  bool bVar2;
  String SStack_38;
  
  bVar2 = lhs->key != rhs->key;
  (this->super_AssertData).m_failed = bVar2;
  if ((!bVar2) && (pCVar1 = getContextOptions(), pCVar1->success != true)) {
    return;
  }
  stringifyBinaryExpr<supermap::KeyValue<char,unsigned_int>,supermap::KeyValue<char,unsigned_int>>
            (&SStack_38,(detail *)lhs,(KeyValue<char,_unsigned_int> *)0x1be8fa,&rhs->key,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }